

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O0

void __thiscall indk::Position::Position(Position *this,Position *P)

{
  undefined1 auVar1 [16];
  uint uVar2;
  ulong uVar3;
  float *pfVar4;
  float fVar5;
  uint local_1c;
  uint i;
  Position *P_local;
  Position *this_local;
  
  uVar2 = getXm(P);
  this->Xm = uVar2;
  uVar2 = getDimensionsCount(P);
  this->DimensionsCount = uVar2;
  auVar1 = ZEXT416(this->DimensionsCount) * ZEXT816(4);
  uVar3 = auVar1._0_8_;
  if (auVar1._8_8_ != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pfVar4 = (float *)operator_new__(uVar3);
  this->X = pfVar4;
  for (local_1c = 0; local_1c < this->DimensionsCount; local_1c = local_1c + 1) {
    fVar5 = getPositionValue(P,local_1c);
    this->X[local_1c] = fVar5;
  }
  return;
}

Assistant:

indk::Position::Position(const indk::Position &P) {
    Xm = P.getXm();
    DimensionsCount = P.getDimensionsCount();
    X = new float[DimensionsCount];
    for (unsigned int i = 0; i < DimensionsCount; i++) X[i] = P.getPositionValue(i);
}